

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<unsigned_int,long,9>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uint *lhs,long *rhs,uint *result)

{
  uint uVar1;
  ulong uVar2;
  code *pcVar3;
  uint uVar4;
  int *in_RDX;
  ulong *in_RSI;
  uint *in_RDI;
  uint64_t tmp;
  
  if ((long)*in_RSI < 0) {
    if ((ulong)*in_RDI < (*in_RSI ^ 0xffffffffffffffff) + 1) {
LAB_001b3c00:
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    if (SCARRY8((ulong)*in_RDI,*in_RSI)) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *in_RDX = *in_RDI + (int)*in_RSI;
  }
  else {
    uVar1 = *in_RDI;
    uVar2 = *in_RSI;
    uVar4 = std::numeric_limits<unsigned_int>::max();
    if ((ulong)uVar4 < uVar1 + uVar2) goto LAB_001b3c00;
    *in_RDX = (int)(uVar1 + uVar2);
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is unsigned and < 64-bit, rhs std::int64_t
        if( rhs < 0 )
        {
            if( lhs >= ~(std::uint64_t)( rhs ) + 1) //negation is safe, since rhs is 64-bit
            {
                result = (T)( lhs + rhs );
                return;
            }
        }
        else
        {
            // now we know that rhs can be safely cast into an std::uint64_t
            std::uint64_t tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

            // special case - rhs cannot be larger than 0x7fffffffffffffff, lhs cannot be larger than 0xffffffff
            // it is not possible for the operation above to overflow, so just check max
            if( tmp <= std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }
        E::SafeIntOnOverflow();
    }